

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::~PatchVertexCountCase
          (PatchVertexCountCase *this)

{
  PatchVertexCountCase *this_local;
  
  ~PatchVertexCountCase(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

PatchVertexCountCase (Context& context, const char* name, const char* description, int inputPatchSize, int outputPatchSize, const char* referenceImagePath)
		: TestCase				(context, name, description)
		, m_inputPatchSize		(inputPatchSize)
		, m_outputPatchSize		(outputPatchSize)
		, m_referenceImagePath	(referenceImagePath)
	{
	}